

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::extend<2ul,unsigned_int,unsigned_long,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_d8 [8];
  LaneArray<2UL_*_2> lanes;
  LaneArray<2UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<unsigned_int,4>((LaneArray<4> *)local_d8,this,vec);
  lanes._M_elems[3].type.id = 0;
  lVar1 = 0;
  do {
    if (*(long *)((long)&lanes._M_elems[0].field_0 + lVar1 + 8) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_40.i64 = (int64_t)*(uint *)(local_d8 + lVar1);
    local_30 = 3;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)&lanes._M_elems[3].type.id + lVar1);
    if (this_00 != &local_40) {
      Literal::~Literal((Literal *)&this_00->func);
      Literal::Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    Literal::~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&lanes._M_elems[3].type);
  lVar1 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)&lanes._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    Literal::~Literal((Literal *)(local_d8 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}